

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

Atom * __thiscall r_code::vector<r_code::Atom>::operator[](vector<r_code::Atom> *this,size_t i)

{
  reference pvVar1;
  
  if ((ulong)((long)(this->m_vector).super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_vector).super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) <= i) {
    std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::resize(&this->m_vector,i + 1);
  }
  pvVar1 = std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::at(&this->m_vector,i);
  return pvVar1;
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }